

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

void dictRelease(dict *ht)

{
  dictEntry *pdVar1;
  unsigned_long uVar2;
  dictType *pdVar3;
  ulong uVar4;
  dictEntry *__ptr;
  ulong uVar5;
  
  uVar4 = ht->size;
  if (uVar4 != 0) {
    uVar2 = ht->used;
    uVar5 = 0;
    do {
      if (uVar2 == 0) break;
      __ptr = ht->table[uVar5];
      if (ht->table[uVar5] != (dictEntry *)0x0) {
        do {
          pdVar1 = __ptr->next;
          pdVar3 = ht->type;
          if (pdVar3->keyDestructor != (_func_void_void_ptr_void_ptr *)0x0) {
            (*pdVar3->keyDestructor)(ht->privdata,__ptr->key);
            pdVar3 = ht->type;
          }
          if (pdVar3->valDestructor != (_func_void_void_ptr_void_ptr *)0x0) {
            (*pdVar3->valDestructor)(ht->privdata,__ptr->val);
          }
          free(__ptr);
          uVar2 = ht->used - 1;
          ht->used = uVar2;
          __ptr = pdVar1;
        } while (pdVar1 != (dictEntry *)0x0);
        uVar4 = ht->size;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  free(ht->table);
  free(ht);
  return;
}

Assistant:

static void dictRelease(dict *ht) {
    _dictClear(ht);
    free(ht);
}